

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  vec3 lookfrom_00;
  vec3 lookat_00;
  vec3 vup_00;
  ostream *poVar5;
  vec3 local_2d0;
  undefined1 local_2b8 [8];
  ray r;
  double v;
  double u;
  undefined1 local_268 [4];
  int s;
  vec3 color;
  int i;
  int j;
  undefined1 local_1e8 [8];
  camera cam;
  double time1;
  double time0;
  double vfov;
  double aperture;
  double dist_to_focus;
  vec3 vup;
  vec3 lookat;
  vec3 lookfrom;
  shared_ptr<material> local_a4;
  int local_94;
  shared_ptr<xz_rect> local_90;
  undefined1 local_80 [8];
  shared_ptr<hittable> lights;
  undefined1 local_60 [8];
  vec3 background;
  hittable_list world;
  double aspect_ratio;
  int max_depth;
  int samples_per_pixel;
  int image_height;
  int image_width;
  
  cornell_box_plus();
  vec3::vec3((vec3 *)local_60,0.0,0.0,0.0);
  local_94 = 0xd5;
  local_a4.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 0x157;
  local_a4.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0xe3;
  local_a4.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ = 0x14c;
  local_a4.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0x22a;
  std::shared_ptr<material>::shared_ptr((shared_ptr<material> *)(lookfrom.e + 2));
  std::make_shared<xz_rect,int,int,int,int,int,std::shared_ptr<material>>
            ((int *)&local_90,&local_94,
             (int *)((long)&local_a4.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi + 4),
             (int *)&local_a4.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (int *)((long)&local_a4.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    + 4),&local_a4);
  std::shared_ptr<hittable>::shared_ptr<xz_rect,void>((shared_ptr<hittable> *)local_80,&local_90);
  std::shared_ptr<xz_rect>::~shared_ptr(&local_90);
  std::shared_ptr<material>::~shared_ptr((shared_ptr<material> *)(lookfrom.e + 2));
  vec3::vec3((vec3 *)(lookat.e + 2),278.0,278.0,-800.0);
  vec3::vec3((vec3 *)(vup.e + 2),278.0,278.0,0.0);
  vec3::vec3((vec3 *)&dist_to_focus,0.0,1.0,0.0);
  cam.time1 = 1.0;
  lookfrom_00.e[1] = lookfrom.e[0];
  lookfrom_00.e[0] = lookat.e[2];
  lookfrom_00.e[2] = lookfrom.e[1];
  lookat_00.e[1] = lookat.e[0];
  lookat_00.e[0] = vup.e[2];
  lookat_00.e[2] = lookat.e[1];
  vup_00.e[1] = vup.e[0];
  vup_00.e[0] = dist_to_focus;
  vup_00.e[2] = vup.e[1];
  camera::camera((camera *)local_1e8,lookfrom_00,lookat_00,vup_00,40.0,2.0,1.0,10.0,0.0,1.0);
  poVar5 = std::operator<<((ostream *)&std::cout,"P3\n");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,200);
  poVar5 = std::operator<<(poVar5,' ');
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,100);
  std::operator<<(poVar5,"\n255\n");
  for (color.e[2]._4_4_ = 99; -1 < color.e[2]._4_4_; color.e[2]._4_4_ = color.e[2]._4_4_ + -1) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"\rScanlines remaining: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,color.e[2]._4_4_);
    poVar5 = std::operator<<(poVar5,' ');
    std::ostream::operator<<(poVar5,std::flush<char,std::char_traits<char>>);
    for (color.e[2]._0_4_ = 0; color.e[2]._0_4_ < 200; color.e[2]._0_4_ = color.e[2]._0_4_ + 1) {
      vec3::vec3((vec3 *)local_268,0.0,0.0,0.0);
      for (u._4_4_ = 0; u._4_4_ < 100; u._4_4_ = u._4_4_ + 1) {
        dVar1 = (double)color.e[2]._0_4_;
        dVar2 = random_double();
        dVar3 = (double)color.e[2]._4_4_;
        dVar4 = random_double();
        r.tm = (dVar3 + dVar4) / 100.0;
        camera::get_ray((ray *)local_2b8,(camera *)local_1e8,(dVar1 + dVar2) / 200.0,r.tm);
        ray_color(&local_2d0,(ray *)local_2b8,(vec3 *)local_60,(hittable *)(background.e + 2),
                  (shared_ptr<hittable> *)local_80,0x32);
        vec3::operator+=((vec3 *)local_268,&local_2d0);
      }
      vec3::write_color((vec3 *)local_268,(ostream *)&std::cout,100);
    }
  }
  std::operator<<((ostream *)&std::cerr,"\nDone.\n");
  std::shared_ptr<hittable>::~shared_ptr((shared_ptr<hittable> *)local_80);
  hittable_list::~hittable_list((hittable_list *)(background.e + 2));
  return 0;
}

Assistant:

int main() {

    // Image
    const int image_width = 200;
    const int image_height = 100;
    const int samples_per_pixel = 100;
    const int max_depth = 50;
    const auto aspect_ratio = double(image_width) / image_height;

    // World
    //auto world = random_scene();
    //auto world = two_spheres();
    //auto world = two_perlin_spheres();
    //auto world = earth();
    //auto world = simple_light();
    //auto world = cornell_box();
    //auto world = cornell_smoke();
    //auto world = final_scene();
    auto world = cornell_box_plus();

    const vec3 background(0, 0, 0);
    shared_ptr<hittable> lights =
            make_shared<xz_rect>(213, 343, 227, 332, 554, shared_ptr<material>());

    // Camera
    vec3 lookfrom(278, 278, -800);
    vec3 lookat(278, 278, 0);
    vec3 vup(0, 1, 0);
    auto dist_to_focus = 10.0;
    auto aperture = 1.0;
    auto vfov = 40.0;
    auto time0 = 0.0;
    auto time1 = 1.0;

    camera cam(lookfrom, lookat, vup, vfov, aspect_ratio, aperture, dist_to_focus, time0, time1);

    // Render
    std::cout << "P3\n" << image_width << ' ' << image_height << "\n255\n";

    for (int j = image_height - 1; j >= 0; --j) {
        std::cerr << "\rScanlines remaining: " << j << ' ' << std::flush;
        for (int i = 0; i < image_width; ++i) {
            vec3 color(0,0,0);
            for (int s = 0; s < samples_per_pixel; ++s) {
                auto u = (i + random_double()) / image_width;
                auto v = (j + random_double()) / image_height;
                ray r = cam.get_ray(u,v);
                color += ray_color(r, background, world, lights, max_depth);
            }
            color.write_color(std::cout,samples_per_pixel);
        }
    }

    std::cerr << "\nDone.\n";
}